

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O0

Pass * wasm::createSSAifyPass(void)

{
  SSAify *this;
  
  this = (SSAify *)operator_new(0x90);
  SSAify::SSAify(this,true);
  return &this->super_Pass;
}

Assistant:

Pass* createSSAifyPass() { return new SSAify(true); }